

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

bool cppwinrt::has_fastabi(TypeDef *type)

{
  bool bVar1;
  string_view local_20;
  string_view local_10;
  
  if (settings[0x1d0] == '\x01') {
    local_10._M_len = 0x1b;
    local_10._M_str = "Windows.Foundation.Metadata";
    local_20._M_len = 0x10;
    local_20._M_str = "FastAbiAttribute";
    bVar1 = has_attribute<winmd::reader::TypeDef>(type,&local_10,&local_20);
    return bVar1;
  }
  return false;
}

Assistant:

static bool has_fastabi(TypeDef const& type)
    {
        return settings.fastabi&& has_attribute(type, "Windows.Foundation.Metadata", "FastAbiAttribute");
    }